

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

uint __thiscall
ON_MeshComponentRef::GetMeshTopologyVertexAndPoint
          (ON_MeshComponentRef *this,ON_MeshTopologyVertex **topv,ON_3dPoint *point)

{
  TYPE TVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint *puVar5;
  ON_MeshTopologyVertex *pOVar6;
  ON_MeshTopologyVertex *v;
  undefined1 local_48 [4];
  int tvi;
  ON_3dPointListRef vertex_list;
  ON_MeshTopology *top;
  ON_3dPoint *point_local;
  ON_MeshTopologyVertex **topv_local;
  ON_MeshComponentRef *this_local;
  
  if (((this->m_mesh != (ON_Mesh *)0x0) && (-1 < (this->m_mesh_ci).m_index)) &&
     (vertex_list.m_fP = (float *)MeshTopology(this),
     (ON_MeshTopology *)vertex_list.m_fP != (ON_MeshTopology *)0x0)) {
    ON_3dPointListRef::ON_3dPointListRef((ON_3dPointListRef *)local_48,this->m_mesh);
    uVar2 = ON_SimpleArray<int>::UnsignedCount((ON_SimpleArray<int> *)(vertex_list.m_fP + 2));
    uVar3 = ON_3dPointListRef::PointCount((ON_3dPointListRef *)local_48);
    if (uVar2 == uVar3) {
      TVar1 = (this->m_mesh_ci).m_type;
      if (TVar1 == mesh_vertex) {
        uVar2 = (this->m_mesh_ci).m_index;
        uVar3 = ON_3dPointListRef::PointCount((ON_3dPointListRef *)local_48);
        if (uVar2 < uVar3) {
          puVar5 = (uint *)ON_SimpleArray<int>::operator[]
                                     ((ON_SimpleArray<int> *)(vertex_list.m_fP + 2),
                                      (this->m_mesh_ci).m_index);
          uVar2 = *puVar5;
          if ((-1 < (int)uVar2) &&
             (iVar4 = ON_SimpleArray<ON_MeshTopologyVertex>::Count
                                ((ON_SimpleArray<ON_MeshTopologyVertex> *)(vertex_list.m_fP + 8)),
             (int)uVar2 < iVar4)) {
            pOVar6 = ON_SimpleArray<ON_MeshTopologyVertex>::operator[]
                               ((ON_SimpleArray<ON_MeshTopologyVertex> *)(vertex_list.m_fP + 8),
                                uVar2);
            *topv = pOVar6;
            ON_3dPointListRef::GetPoint
                      ((ON_3dPointListRef *)local_48,(this->m_mesh_ci).m_index,&point->x);
            return uVar2;
          }
        }
      }
      else if ((TVar1 == meshtop_vertex) &&
              (uVar2 = (this->m_mesh_ci).m_index,
              uVar3 = ON_SimpleArray<ON_MeshTopologyVertex>::UnsignedCount
                                ((ON_SimpleArray<ON_MeshTopologyVertex> *)(vertex_list.m_fP + 8)),
              uVar2 < uVar3)) {
        pOVar6 = ON_SimpleArray<ON_MeshTopologyVertex>::operator[]
                           ((ON_SimpleArray<ON_MeshTopologyVertex> *)(vertex_list.m_fP + 8),
                            (this->m_mesh_ci).m_index);
        *topv = pOVar6;
        if ((pOVar6->m_v_count < 1) ||
           (((pOVar6->m_vi == (int *)0x0 || (*pOVar6->m_vi < 0)) ||
            (uVar2 = *pOVar6->m_vi,
            uVar3 = ON_3dPointListRef::PointCount((ON_3dPointListRef *)local_48), uVar3 <= uVar2))))
        {
          point->x = ON_3dPoint::UnsetPoint.x;
          point->y = ON_3dPoint::UnsetPoint.y;
          point->z = ON_3dPoint::UnsetPoint.z;
        }
        else {
          ON_3dPointListRef::GetPoint((ON_3dPointListRef *)local_48,*pOVar6->m_vi,&point->x);
        }
        return (this->m_mesh_ci).m_index;
      }
    }
  }
  *topv = (ON_MeshTopologyVertex *)0x0;
  point->x = ON_3dPoint::UnsetPoint.x;
  point->y = ON_3dPoint::UnsetPoint.y;
  point->z = ON_3dPoint::UnsetPoint.z;
  return 0xffffffff;
}

Assistant:

unsigned int ON_MeshComponentRef::GetMeshTopologyVertexAndPoint(
  const struct ON_MeshTopologyVertex*& topv,
  class ON_3dPoint& point
  ) const
{
  if ( m_mesh && m_mesh_ci.m_index >= 0 )
  {
    const ON_MeshTopology* top = MeshTopology();
    if ( 0 != top )
    {
      const ON_3dPointListRef vertex_list(m_mesh);
      if ( top->m_topv_map.UnsignedCount() == vertex_list.PointCount() )
      {
        switch(m_mesh_ci.m_type)
        {
        case ON_COMPONENT_INDEX::mesh_vertex:
          if ( (unsigned int)m_mesh_ci.m_index < vertex_list.PointCount() )
          {
            int tvi = top->m_topv_map[m_mesh_ci.m_index];
            if ( tvi >= 0 && tvi < top->m_topv.Count() )
            {
              topv = &top->m_topv[tvi];
              vertex_list.GetPoint(m_mesh_ci.m_index,&point.x);
              return (unsigned int)tvi;
            }
          }
          break;

        case ON_COMPONENT_INDEX::meshtop_vertex:
          if ( (unsigned int)m_mesh_ci.m_index < top->m_topv.UnsignedCount() )
          {
            const ON_MeshTopologyVertex& v = top->m_topv[m_mesh_ci.m_index];
            topv = &v;
            if ( v.m_v_count > 0 && 0 != v.m_vi && v.m_vi[0] >= 0 && (unsigned int)v.m_vi[0] < vertex_list.PointCount() )
              vertex_list.GetPoint(v.m_vi[0],&point.x);
            else
              point = ON_3dPoint::UnsetPoint;
            return (unsigned int)m_mesh_ci.m_index;
          }
          break;
        
        default:
          break;
        }
      }
    }
  }

  topv = 0;
  point = ON_3dPoint::UnsetPoint;
  return ON_UNSET_UINT_INDEX;
}